

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O1

int fp_get_param(int argc,char **argv,fpstate *fpptr)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  bool bVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  ushort **ppuVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  bool bVar16;
  char tile [513];
  char tmp [513];
  long local_480;
  int local_46c;
  char local_448 [512];
  undefined1 local_248;
  char local_238 [520];
  
  if (fpptr->initialized == 0x2a) {
    local_448[0] = '\0';
    bVar4 = 1 < argc;
    if (argc < 2) {
      iVar15 = 1;
      bVar8 = true;
      bVar16 = true;
      bVar6 = true;
      bVar7 = true;
    }
    else {
      iVar15 = 1;
      bVar7 = false;
      bVar6 = false;
      bVar16 = false;
      local_46c = 0;
      bVar8 = false;
      do {
        pcVar14 = argv[iVar15];
        if (((((((*pcVar14 != '-') || (sVar11 = strlen(pcVar14), sVar11 != 2)) &&
               (iVar9 = strncmp(pcVar14,"-q",2), iVar9 != 0)) &&
              ((iVar9 = strncmp(pcVar14,"-qz",3), iVar9 != 0 &&
               (iVar9 = strncmp(pcVar14,"-g1",3), iVar9 != 0)))) &&
             ((iVar9 = strncmp(pcVar14,"-g2",3), iVar9 != 0 &&
              ((iVar9 = strncmp(pcVar14,"-i2f",4), iVar9 != 0 &&
               (iVar9 = strncmp(pcVar14,"-n3ratio",8), iVar9 != 0)))))) &&
            (iVar9 = strncmp(pcVar14,"-n3min",6), iVar9 != 0)) &&
           ((iVar9 = strncmp(pcVar14,"-tableonly",10), iVar9 != 0 &&
            (iVar9 = strncmp(pcVar14,"-table",6), iVar9 != 0)))) break;
        bVar1 = pcVar14[1];
        if (0x67 < bVar1) {
          if (bVar1 == 0x68) {
            fpptr->comptype = 0x29;
          }
          else if (bVar1 == 0x70) {
            fpptr->comptype = 0x1f;
          }
          else {
            if (bVar1 != 0x72) goto LAB_00103a9d;
            fpptr->comptype = 0xb;
          }
LAB_00103a76:
          bVar4 = !bVar16;
          bVar16 = true;
          if (bVar4) goto LAB_00103a88;
          pcVar14 = "Error: multiple compression flags\n";
          goto LAB_0010406c;
        }
        if (bVar1 == 100) {
          fpptr->comptype = -1;
          goto LAB_00103a76;
        }
        if (bVar1 == 0x67) {
          fpptr->comptype = (pcVar14[2] == '2') + 0x15;
          goto LAB_00103a76;
        }
LAB_00103a9d:
        iVar9 = strcmp(pcVar14,"-i2f");
        if (iVar9 == 0) {
          fpptr->int_to_float = 1;
          goto LAB_00103a88;
        }
        iVar9 = strcmp(pcVar14,"-n3ratio");
        if (iVar9 == 0) {
          iVar15 = iVar15 + 1;
          if (iVar15 < argc) {
            dVar5 = atof(argv[iVar15]);
            fpptr->n3ratio = (float)dVar5;
            goto LAB_00103a88;
          }
          goto LAB_00104071;
        }
        iVar9 = strcmp(pcVar14,"-n3min");
        if (iVar9 == 0) {
          iVar15 = iVar15 + 1;
          if (iVar15 < argc) {
            dVar5 = atof(argv[iVar15]);
            fpptr->n3min = (float)dVar5;
            goto LAB_00103a88;
          }
          goto LAB_00104071;
        }
        if (bVar1 == 0x6e) {
          iVar15 = iVar15 + 1;
          if (iVar15 < argc) {
            dVar5 = atof(argv[iVar15]);
            fpptr->rescale_noise = (float)dVar5;
            goto LAB_00103a88;
          }
          goto LAB_00104071;
        }
        if (bVar1 == 0x73) {
          iVar15 = iVar15 + 1;
          if (iVar15 < argc) {
            dVar5 = atof(argv[iVar15]);
            fpptr->scale = (float)dVar5;
            goto LAB_00103a88;
          }
          goto LAB_00104071;
        }
        if (bVar1 == 0x71) {
          cVar2 = pcVar14[2];
          if (cVar2 == 't') {
            fpptr->dither_offset = -1;
          }
          else if (cVar2 == 'z') {
            fpptr->dither_method = 2;
            cVar2 = pcVar14[3];
            if ((long)cVar2 == 0x74) {
              fpptr->dither_offset = -1;
            }
            else {
              ppuVar12 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) != 0) {
                pcVar14 = pcVar14 + 3;
                goto LAB_00103d10;
              }
            }
          }
          else {
            ppuVar12 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) != 0) {
              pcVar14 = pcVar14 + 2;
LAB_00103d10:
              uVar10 = atoi(pcVar14);
              if (uVar10 == 0) {
                fpptr->no_dither = 1;
              }
              else {
                if (10000 < uVar10) {
                  pcVar14 = "Error: invalid q suffix\n";
                  goto LAB_0010406c;
                }
                fpptr->dither_offset = uVar10;
              }
            }
          }
          iVar15 = iVar15 + 1;
          if (iVar15 < argc) {
            dVar5 = atof(argv[iVar15]);
            fpptr->quantize_level = (float)dVar5;
            goto LAB_00103a88;
          }
          goto LAB_00104071;
        }
        iVar9 = strcmp(pcVar14,"-tableonly");
        if (iVar9 == 0) {
          fp_get_param_cold_2();
          goto LAB_00103a88;
        }
        iVar9 = strcmp(pcVar14,"-table");
        if (iVar9 == 0) {
          fp_get_param_cold_1();
          goto LAB_00103a88;
        }
        if (0x73 < bVar1) {
          if (bVar1 == 0x77) {
            if (bVar8) {
LAB_001040d9:
              pcVar14 = "Error: multiple tile specifications\n";
              goto LAB_0010406c;
            }
            local_46c = local_46c + 1;
          }
          else {
            if (bVar1 == 0x76) {
              fpptr->verbose = 1;
              goto LAB_00103a88;
            }
            if (bVar1 != 0x74) goto switchD_00103c5a_caseD_45;
            if (bVar8) goto LAB_001040d9;
            iVar15 = iVar15 + 1;
            if (argc <= iVar15) goto LAB_00104071;
            strncpy(local_448,argv[iVar15],0x200);
            local_248 = 0;
          }
          bVar8 = true;
          goto LAB_00103a88;
        }
        switch(bVar1) {
        case 0x43:
          fpptr->do_checksums = 0;
          break;
        case 0x44:
          fpptr->delete_input = fpptr->delete_input + 1;
          break;
        default:
switchD_00103c5a_caseD_45:
          fp_msg("Error: unknown command line flag `");
          fp_msg(argv[iVar15]);
          fp_msg("\'\n");
LAB_00104139:
          fp_usage();
          fp_hint();
          goto LAB_00104090;
        case 0x46:
          fpptr->clobber = fpptr->clobber + 1;
          break;
        case 0x48:
          fp_help();
          goto LAB_00104100;
        case 0x4c:
          fpptr->listonly = fpptr->listonly + 1;
          break;
        case 0x4f:
          if (bVar6) {
            pcVar14 = "Error: -O option is not allowed with -R\n";
            goto LAB_0010408b;
          }
          iVar15 = iVar15 + 1;
          if (argc <= iVar15) goto LAB_00104139;
          strncpy(fpptr->outfile,argv[iVar15],0x200);
          fpptr->outfile[0x200] = '\0';
          bVar7 = true;
          bVar6 = false;
          break;
        case 0x52:
          if (bVar7) {
            pcVar14 = "Error: -R option is not allowed with -O\n";
            goto LAB_0010408b;
          }
          iVar15 = iVar15 + 1;
          if (argc <= iVar15) goto LAB_00104139;
          strncpy(fpptr->outfile,argv[iVar15],0x200);
          fpptr->outfile[0x200] = '\0';
          bVar7 = false;
          bVar6 = true;
          break;
        case 0x53:
          fpptr->to_stdout = fpptr->to_stdout + 1;
          break;
        case 0x54:
          fpptr->test_all = 1;
          break;
        case 0x56:
          fp_version();
LAB_00104100:
          exit(0);
        case 0x59:
          fpptr->do_not_prompt = fpptr->do_not_prompt + 1;
        }
LAB_00103a88:
        iVar15 = iVar15 + 1;
        bVar4 = iVar15 < argc;
      } while (iVar15 < argc);
      bVar6 = !bVar6;
      bVar7 = !bVar7;
      bVar16 = local_46c == 0;
      bVar8 = !bVar8;
    }
    if ((bVar6) || (fpptr->test_all != 0)) {
      if ((bVar7) || ((fpptr->test_all == 0 && (fpptr->to_stdout == 0)))) {
        if (((fpptr->scale == 0.0) && (!NAN(fpptr->scale))) ||
           ((fpptr->comptype == 0x29 || (fpptr->test_all == 1)))) {
          if ((fpptr->quantize_level != 0.0) || (NAN(fpptr->quantize_level))) {
LAB_00103f2c:
            if (bVar16) {
              if (!bVar8) {
                sVar11 = strlen(local_448);
                local_480 = 0;
                iVar9 = 0;
                do {
                  if ((int)sVar11 <= iVar9) goto LAB_0010403f;
                  ppuVar12 = __ctype_b_loc();
                  puVar3 = *ppuVar12;
                  lVar13 = (long)iVar9;
                  iVar9 = iVar9 + -1;
                  pcVar14 = local_448 + lVar13;
                  while( true ) {
                    cVar2 = local_448[lVar13];
                    if (((long)cVar2 != 0x2c) && ((puVar3[cVar2] & 0x800) == 0)) {
                      fp_msg("Error: `-t\' requires comma separated tile dims, ");
                      pcVar14 = "e.g., `-t 100,100\'\n";
                      goto LAB_0010408b;
                    }
                    if (cVar2 != ',') break;
                    lVar13 = lVar13 + 1;
                    iVar9 = iVar9 + 1;
                    pcVar14 = pcVar14 + 1;
                    if ((int)sVar11 == lVar13) goto LAB_0010403f;
                  }
                  lVar13 = atol(local_448 + lVar13);
                  fpptr->ntile[local_480] = lVar13;
                  do {
                    cVar2 = *pcVar14;
                    iVar9 = iVar9 + 1;
                    pcVar14 = pcVar14 + 1;
                  } while ((*(byte *)((long)puVar3 + (long)cVar2 * 2 + 1) & 8) != 0);
                  local_480 = local_480 + 1;
                } while (local_480 != 7);
                fp_msg("Error: too many dimensions for `-t\', max=");
                pcVar14 = local_238;
                snprintf(pcVar14,0x201,"%d\n",6);
                goto LAB_0010408b;
              }
            }
            else {
              *(undefined4 *)(fpptr->ntile + 4) = 0xffffffff;
              *(undefined4 *)((long)fpptr->ntile + 0x24) = 0xffffffff;
              *(undefined4 *)(fpptr->ntile + 5) = 0xffffffff;
              *(undefined4 *)((long)fpptr->ntile + 0x2c) = 0xffffffff;
              *(undefined4 *)(fpptr->ntile + 2) = 0xffffffff;
              *(undefined4 *)((long)fpptr->ntile + 0x14) = 0xffffffff;
              *(undefined4 *)(fpptr->ntile + 3) = 0xffffffff;
              *(undefined4 *)((long)fpptr->ntile + 0x1c) = 0xffffffff;
              *(undefined4 *)fpptr->ntile = 0xffffffff;
              *(undefined4 *)((long)fpptr->ntile + 4) = 0xffffffff;
              *(undefined4 *)(fpptr->ntile + 1) = 0xffffffff;
              *(undefined4 *)((long)fpptr->ntile + 0xc) = 0xffffffff;
            }
LAB_0010403f:
            if (bVar4) {
              fpptr->firstfile = iVar15;
              return 0;
            }
            pcVar14 = "Error: no FITS files to compress\n";
LAB_0010406c:
            fp_msg(pcVar14);
LAB_00104071:
            fp_usage();
            goto LAB_00104090;
          }
          if (fpptr->comptype - 0x15U < 2) {
            if (fpptr->int_to_float != 1) goto LAB_00103f2c;
            pcVar14 = "Error: `-q 0\' not allowed with -i2f\n";
          }
          else {
            pcVar14 = "Error: `-q 0\' only allowed with GZIP\n";
          }
        }
        else {
          pcVar14 = "Error: `-s\' requires `-h or -T\'\n";
        }
      }
      else {
        pcVar14 = "Error: -O option may not be used with -S or -T\n";
      }
    }
    else {
      pcVar14 = "Error: -R option may only be used with -T\n";
    }
  }
  else {
    pcVar14 = "Error: internal initialization error\n";
  }
LAB_0010408b:
  fp_msg(pcVar14);
LAB_00104090:
  exit(-1);
}

Assistant:

int fp_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	gottype=0, gottile=0, wholetile=0, iarg, len, ndim, ii, doffset;
        int     gotR=0, gotO=0;
	char	tmp[SZ_STR], tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if ((argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) ||
	        !strncmp(argv[iarg], "-q", 2) || !strncmp(argv[iarg], "-qz", 3) ||
	        !strncmp(argv[iarg], "-g1", 3) || !strncmp(argv[iarg], "-g2", 3) ||
	        !strncmp(argv[iarg], "-i2f", 4) ||
	        !strncmp(argv[iarg], "-n3ratio", 8) || !strncmp(argv[iarg], "-n3min", 6) ||
	        !strncmp(argv[iarg], "-tableonly", 10) || !strncmp(argv[iarg], "-table", 6) )  
	    {

		/* Rice is the default, so -r is superfluous  */
		if (       argv[iarg][1] == 'r') {
		    fpptr->comptype = RICE_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'p') {
		    fpptr->comptype = PLIO_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'g') {
		    /* test for modifiers following the 'g' */
                    if (argv[iarg][2] == '2')
		        fpptr->comptype = GZIP_2;
		    else
		        fpptr->comptype = GZIP_1;

		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
/*
		} else if (argv[iarg][1] == 'b') {
		    fpptr->comptype = BZIP2_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
*/
		} else if (argv[iarg][1] == 'h') {
		    fpptr->comptype = HCOMPRESS_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'd') {
		    fpptr->comptype = NOCOMPRESS;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (!strcmp(argv[iarg], "-i2f")) {
		    /* this means convert integer images to float, and then */
		    /* quantize and compress the float image.  This lossy */
		    /* compression method may give higher compression than the */
		    /* lossless compression method that is usually applied to */
		    /* integer images. */
		    
		    fpptr->int_to_float = 1;

		} else if (!strcmp(argv[iarg], "-n3ratio")) {
		    /* this is the minimum ratio between the MAD noise sigma */
		    /* and the q parameter value in the case where the integer */
		    /* image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3ratio = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-n3min")) {
		    /* this is the minimum  MAD noise sigma in the case where the */
		    /* integer image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3min = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'q') {
		    /* test for modifiers following the 'q' */

                    if (argv[iarg][2] == 'z') {
		        fpptr->dither_method = 2;  /* preserve zero pixels */

                        if (argv[iarg][3] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][3])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+3);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    } else {
                        if (argv[iarg][2] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][2])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+2);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    }

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->quantize_level = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'n') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->rescale_noise = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 's') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->scale = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-tableonly")) {
		    fpptr->do_tables = 1;
		    fpptr->do_images = 0;
                    /* Do not write this to stdout via fp_msg.  Otherwise it will be placed at start of piped FITS
                       file, which will then be corrupted. */
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (!strcmp(argv[iarg], "-table")) {
		    fpptr->do_tables = 1;
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (argv[iarg][1] == 't') {
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			strncpy (tile, argv[iarg], SZ_STR-1); /* checked below */
                        tile[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'w') {
		    wholetile++;
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		} else if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;       /* overwrite existing file */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'Y') {
		    fpptr->do_not_prompt++;

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'T') {
		    fpptr->test_all = 1;

		} else if (argv[iarg][1] == 'R') {
                    if (gotO) {
                        fp_msg("Error: -R option is not allowed with -O\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotR=1;
                    }

		} else if (argv[iarg][1] == 'H') {
		    fp_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);
                    
                } else if (argv[iarg][1] == 'O') {
                    if (gotR) {
                        fp_msg("Error: -O option is not allowed with -R\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotO=1;
                    }
                
		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fp_usage (); fp_hint (); exit (-1);
		}

	    } else
		break;
	}

        /* In earlier loop, already made sure both -O and -R are not being used.
           This is essential, as each must store info in the same 'outfile' array. 
           Now do additional tests of -O and -R with other flags. */
        
        if (gotR && !fpptr->test_all) {
            fp_msg("Error: -R option may only be used with -T\n"); exit(-1);
        }
        
        if (gotO && (fpptr->test_all || fpptr->to_stdout)) {
            fp_msg("Error: -O option may not be used with -S or -T\n"); exit(-1);
        }
        
	if (fpptr->scale != 0. && 
	         fpptr->comptype != HCOMPRESS_1 && fpptr->test_all != 1) {

	    fp_msg ("Error: `-s' requires `-h or -T'\n"); exit (-1);
	}

	if (fpptr->quantize_level == 0) {
	
	    if ((fpptr->comptype != GZIP_1) && (fpptr->comptype != GZIP_2)) {
	        fp_msg ("Error: `-q 0' only allowed with GZIP\n"); exit (-1);
	    }

            if (fpptr->int_to_float == 1) {
	        fp_msg ("Error: `-q 0' not allowed with -i2f\n"); exit (-1);
	    }
	}

	if (wholetile) {
	    for (ndim=0; ndim < MAX_COMPRESS_DIM; ndim++)
		fpptr->ntile[ndim] = (long) -1;

	} else if (gottile) {
	    len = strlen (tile);
	    for (ii=0, ndim=0; ii < len; ) {
		if (! (isdigit (tile[ii]) || tile[ii] == ',')) {
		    fp_msg ("Error: `-t' requires comma separated tile dims, ");
		    fp_msg ("e.g., `-t 100,100'\n"); exit (-1);
		}

		if (tile[ii] == ',') { ii++; continue; }

		fpptr->ntile[ndim] = atol (&tile[ii]);
		for ( ; isdigit(tile[ii]); ii++);

		if (++ndim > MAX_COMPRESS_DIM) {
		    fp_msg ("Error: too many dimensions for `-t', max=");
		    snprintf (tmp, SZ_STR,"%d\n", MAX_COMPRESS_DIM); fp_msg (tmp);
		    exit (-1);
		}
	    }
	}

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to compress\n");
	    fp_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}